

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBase.c
# Opt level: O1

ZyanStatus
ZydisFormatterBaseFormatOperandPTR
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  void **ppvVar1;
  ZyanUSize ZVar2;
  ulong uVar3;
  void *pvVar4;
  ZyanStatus ZVar5;
  ZyanStatus unaff_EBP;
  ZyanUSize ZVar6;
  ZyanU8 ZVar7;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0xa7,
                  "ZyanStatus ZydisFormatterBaseFormatOperandPTR(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0xa8,
                  "ZyanStatus ZydisFormatterBaseFormatOperandPTR(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0xa9,
                  "ZyanStatus ZydisFormatterBaseFormatOperandPTR(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if ((buffer->is_token_list != '\0') &&
     (unaff_EBP = ZydisFormatterBufferAppend(buffer,'\v'), (int)unaff_EBP < 0)) {
    return unaff_EBP;
  }
  if (formatter->addr_base == ZYDIS_NUMERIC_BASE_HEX) {
    ZVar5 = ZydisStringAppendHexU
                      (&buffer->string,(ulong)(context->operand->field_10).ptr.segment,'\x04',
                       formatter->hex_force_leading_number,formatter->hex_uppercase,
                       formatter->number_format[1][0].string,formatter->number_format[1][1].string);
LAB_00117a22:
    if ((int)ZVar5 < 0) {
      return ZVar5;
    }
    if (buffer->is_token_list == '\0') {
      if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) {
        __assert_fail("!destination->vector.allocator",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0xeb,
                      "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
      }
      ZVar2 = (buffer->string).vector.size;
      if (ZVar2 == 0) {
        __assert_fail("destination->vector.size && source->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0xec,
                      "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
      }
      uVar3 = (buffer->string).vector.capacity;
      ZVar5 = 0x80100009;
      if (ZVar2 + 1 <= uVar3) {
        *(undefined2 *)((long)(buffer->string).vector.data + (ZVar2 - 1)) = 0x3a;
        ZVar6 = (buffer->string).vector.size;
        pvVar4 = (buffer->string).vector.data;
        (buffer->string).vector.size = ZVar6 + 1;
        ZVar5 = unaff_EBP;
        if (*(char *)((long)pvVar4 + ZVar6) != '\0') {
          __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                        ,0xf7,
                        "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)")
          ;
        }
      }
      if (uVar3 < ZVar2 + 1) {
        return ZVar5;
      }
    }
    else {
      ZVar2 = (buffer->string).vector.size;
      if (0xfe < ZVar2 - 1) {
        __assert_fail("(len > 0) && (len < 256)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                      ,0xe7,
                      "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
                     );
      }
      uVar3 = buffer->capacity;
      ZVar5 = 0x80100009;
      if (ZVar2 + 4 < uVar3) {
        pvVar4 = (buffer->string).vector.data;
        *(char *)((long)pvVar4 + -1) = (char)ZVar2;
        *(undefined4 *)((long)pvVar4 + ZVar2) = 0x3a0002;
        ZVar6 = buffer->capacity - (ZVar2 + 2);
        buffer->capacity = ZVar6;
        ppvVar1 = &(buffer->string).vector.data;
        *ppvVar1 = (void *)((long)*ppvVar1 + ZVar2 + 2);
        (buffer->string).vector.size = 2;
        if (0xfe < ZVar6) {
          ZVar6 = 0xff;
        }
        (buffer->string).vector.capacity = ZVar6;
        ZVar5 = unaff_EBP;
      }
      if (uVar3 <= ZVar2 + 4) {
        return ZVar5;
      }
    }
    ZVar7 = context->instruction->operand_width;
    if (ZVar7 == '\x10') {
      ZVar7 = '\x04';
    }
    else {
      if (ZVar7 != ' ') goto LAB_00117b10;
      ZVar7 = '\b';
    }
    if ((buffer->is_token_list == '\0') ||
       (ZVar5 = ZydisFormatterBufferAppend(buffer,'\v'), -1 < (int)ZVar5)) {
      if (formatter->addr_base == ZYDIS_NUMERIC_BASE_HEX) {
        ZVar5 = ZydisStringAppendHexU
                          (&buffer->string,(ulong)(context->operand->field_10).mem.segment,ZVar7,
                           formatter->hex_force_leading_number,formatter->hex_uppercase,
                           formatter->number_format[1][0].string,
                           formatter->number_format[1][1].string);
      }
      else {
        if (formatter->addr_base != ZYDIS_NUMERIC_BASE_DEC) {
          return 0x80100004;
        }
        ZVar5 = ZydisStringAppendDecU
                          (&buffer->string,(ulong)(context->operand->field_10).mem.segment,ZVar7,
                           formatter->number_format[0][0].string,
                           formatter->number_format[0][1].string);
      }
      if (-1 < (int)ZVar5) {
        ZVar5 = 0x100000;
      }
    }
  }
  else {
    if (formatter->addr_base == ZYDIS_NUMERIC_BASE_DEC) {
      ZVar5 = ZydisStringAppendDecU
                        (&buffer->string,(ulong)(context->operand->field_10).ptr.segment,'\x04',
                         formatter->number_format[0][0].string,formatter->number_format[0][1].string
                        );
      goto LAB_00117a22;
    }
LAB_00117b10:
    ZVar5 = 0x80100004;
  }
  return ZVar5;
}

Assistant:

ZyanStatus ZydisFormatterBaseFormatOperandPTR(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_IMMEDIATE);
    ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->addr_base, &buffer->string,
        context->operand->ptr.segment, 4, formatter->hex_force_leading_number);
    ZYDIS_BUFFER_APPEND(buffer, DELIM_SEGMENT);

    ZyanU8 padding;
    switch (context->instruction->operand_width)
    {
    case 16:
        padding = 4;
        break;
    case 32:
        padding = 8;
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_IMMEDIATE);
    ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->addr_base, &buffer->string,
        context->operand->ptr.offset , padding, formatter->hex_force_leading_number);

    return ZYAN_STATUS_SUCCESS;
}